

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

void LoadFunction(LoadState *S,Proto *f,TString *psource)

{
  lu_byte lVar1;
  int iVar2;
  TString *pTVar3;
  TString *psource_local;
  Proto *f_local;
  LoadState *S_local;
  
  pTVar3 = LoadString(S);
  f->source = pTVar3;
  if (f->source == (TString *)0x0) {
    f->source = psource;
  }
  iVar2 = LoadInt(S);
  f->linedefined = iVar2;
  iVar2 = LoadInt(S);
  f->lastlinedefined = iVar2;
  lVar1 = LoadByte(S);
  f->numparams = lVar1;
  lVar1 = LoadByte(S);
  f->is_vararg = lVar1;
  lVar1 = LoadByte(S);
  f->maxstacksize = lVar1;
  LoadCode(S,f);
  LoadConstants(S,f);
  LoadUpvalues(S,f);
  LoadProtos(S,f);
  LoadDebug(S,f);
  return;
}

Assistant:

static void LoadFunction (LoadState *S, Proto *f, TString *psource) {
  f->source = LoadString(S);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = LoadInt(S);
  f->lastlinedefined = LoadInt(S);
  f->numparams = LoadByte(S);
  f->is_vararg = LoadByte(S);
  f->maxstacksize = LoadByte(S);
  LoadCode(S, f);
  LoadConstants(S, f);
  LoadUpvalues(S, f);
  LoadProtos(S, f);
  LoadDebug(S, f);
}